

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O0

void __thiscall
DebugAllocationTest_FreeQueueTest_Test::~DebugAllocationTest_FreeQueueTest_Test
          (DebugAllocationTest_FreeQueueTest_Test *this)

{
  DebugAllocationTest_FreeQueueTest_Test *this_local;
  
  ~DebugAllocationTest_FreeQueueTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DebugAllocationTest, FreeQueueTest) {
  // Verify that the allocator doesn't return blocks that were recently freed.
  int* x = noopt(new int);
  int* old_x = x;
  delete x;
  x = noopt(new int);
  #if 1
    // This check should not be read as a universal guarantee of behavior.  If
    // other threads are executing, it would be theoretically possible for this
    // check to fail despite the efforts of debugallocation.cc to the contrary.
    // It should always hold under the controlled conditions of this unittest,
    // however.
    EXPECT_NE(x, old_x);  // Allocator shouldn't return recently freed blocks
  #else
    // The below check passes, but since it isn't *required* to pass, I've left
    // it commented out.
    // EXPECT_EQ(x, old_x);
  #endif
  old_x = nullptr;  // avoid breaking opt build with an unused variable warning.
  delete x;
}